

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  string file;
  int local_e4;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_e4 = number;
  if (number == 0) {
    std::operator+(&local_80,&base_name->pathname_,".");
    std::operator+(&local_60,&local_80,extension);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    this = &local_80;
  }
  else {
    std::operator+(&local_c0,&base_name->pathname_,"_");
    StreamableToString<int>(&local_e0,&local_e4);
    std::operator+(&local_a0,&local_c0,&local_e0);
    std::operator+(&local_80,&local_a0,".");
    std::operator+(&local_60,&local_80,extension);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_e0);
    this = &local_c0;
  }
  std::__cxx11::string::~string((string *)this);
  FilePath((FilePath *)&local_60,&local_40);
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}